

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labpack-reader.c
# Opt level: O2

int labpack_read_int(labpack_reader_t *reader)

{
  int32_t iVar1;
  
  if (reader != (labpack_reader_t *)0x0) {
    if (reader->status == LABPACK_STATUS_OK) {
      iVar1 = mpack_expect_i32(reader->decoder);
      labpack_reader_check_decoder(reader);
    }
    else {
      iVar1 = 0;
    }
    return iVar1;
  }
  __assert_fail("reader",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fieldrndservices[P]labpack-c/src/labpack-reader.c"
                ,0x100,"int labpack_read_int(labpack_reader_t *)");
}

Assistant:

int
labpack_read_int(labpack_reader_t* reader)
{
    assert(reader);
    int value = 0;
    if (labpack_reader_is_ok(reader)) {
        value = mpack_expect_int(reader->decoder);
        labpack_reader_check_decoder(reader);
    }
    return value;
}